

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::Delete(FreeList<wabt::interp::Ref> *this,Index index)

{
  reference pvVar1;
  reference local_30;
  value_type local_20;
  size_type local_18;
  Index index_local;
  FreeList<wabt::interp::Ref> *this_local;
  
  local_18 = index;
  index_local = (Index)this;
  memset(&local_20,0,8);
  pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (&this->list_,local_18);
  pvVar1->index = local_20.index;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_free_,local_18);
  std::_Bit_reference::operator=(&local_30,true);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->free_,&local_18);
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}